

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_handle * fxp_got_handle(sftp_packet *pktin)

{
  char *pcVar1;
  ptrlen pl;
  fxp_handle *handle;
  ptrlen id;
  sftp_packet *pktin_local;
  
  pl = BinarySource_get_string(pktin->binarysource_);
  if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
    pktin_local = (sftp_packet *)safemalloc(1,0x10,0);
    pcVar1 = mkstr(pl);
    pktin_local->data = pcVar1;
    *(int *)&pktin_local->length = (int)pl.len;
    sftp_pkt_free(pktin);
  }
  else {
    fxp_internal_error("received malformed FXP_HANDLE");
    sftp_pkt_free(pktin);
    pktin_local = (sftp_packet *)0x0;
  }
  return (fxp_handle *)pktin_local;
}

Assistant:

static struct fxp_handle *fxp_got_handle(struct sftp_packet *pktin)
{
    ptrlen id;
    struct fxp_handle *handle;

    id = get_string(pktin);
    if (get_err(pktin)) {
        fxp_internal_error("received malformed FXP_HANDLE");
        sftp_pkt_free(pktin);
        return NULL;
    }
    handle = snew(struct fxp_handle);
    handle->hstring = mkstr(id);
    handle->hlen = id.len;
    sftp_pkt_free(pktin);
    return handle;
}